

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool slang::ast::Lookup::findAssertionLocalVar
               (ASTContext *context,NameSyntax *syntax,LookupResult *result)

{
  long lVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  NameComponents name;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  char *pcVar6;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this;
  AssertionInstanceDetails *pAVar7;
  bool bVar8;
  SyntaxKind SVar9;
  uint uVar10;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *pSVar11;
  AssertionInstanceDetails *pAVar12;
  uint64_t uVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  value_type_pointer __y;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts_01;
  undefined1 auVar17 [16];
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  int colonParts;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_244;
  LookupResult *local_240;
  ulong local_238;
  group_type_pointer local_230;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *local_228;
  ulong local_220;
  ASTContext *local_218;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_210;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  SourceLocation local_1f8;
  SourceLocation SStack_1f0;
  pointer local_1e8;
  size_t sStack_1e0;
  ParameterValueAssignmentSyntax *local_1d8;
  uchar local_1c8;
  uchar uStack_1c7;
  uchar uStack_1c6;
  byte bStack_1c5;
  uchar uStack_1c4;
  uchar uStack_1c3;
  uchar uStack_1c2;
  byte bStack_1c1;
  uchar uStack_1c0;
  uchar uStack_1bf;
  uchar uStack_1be;
  byte bStack_1bd;
  uchar uStack_1bc;
  uchar uStack_1bb;
  uchar uStack_1ba;
  byte bStack_1b9;
  uchar local_1b8;
  uchar uStack_1b7;
  uchar uStack_1b6;
  byte bStack_1b5;
  uchar uStack_1b4;
  uchar uStack_1b3;
  uchar uStack_1b2;
  byte bStack_1b1;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  byte bStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  byte bStack_1a9;
  NameComponents local_1a0;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_168 [3];
  
  local_244 = 0;
  local_168[0].data_ = (pointer)local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 4;
  SVar9 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  nameParts_01 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)syntax;
  if (SVar9 == ScopedName) {
    nameParts_01 = local_168;
    pSVar11 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
              anon_unknown_39::splitScopedName((ScopedNameSyntax *)syntax,nameParts_01,&local_244);
    if (local_244 == 0) {
      SVar9 = *(SyntaxKind *)&pSVar11->data_;
      nameParts_01 = pSVar11;
      goto LAB_002e9b64;
    }
  }
  else {
LAB_002e9b64:
    if ((SVar9 - IdentifierName < 2) || (SVar9 == ClassName)) {
      anon_unknown_39::NameComponents::NameComponents(&local_1a0,(NameSyntax *)nameParts_01);
      local_1d8 = local_1a0.paramAssignments;
      local_1e8 = local_1a0.selectors._M_ptr;
      sStack_1e0 = local_1a0.selectors._M_extent._M_extent_value;
      local_1f8 = local_1a0.range.startLoc;
      SStack_1f0 = local_1a0.range.endLoc;
      local_208._M_len = local_1a0.text._M_len;
      local_208._M_str = local_1a0.text._M_str;
      pAVar7 = context->assertionInstance;
      do {
        pAVar12 = pAVar7;
        pAVar7 = pAVar12->argDetails;
      } while (pAVar12->argDetails != (AssertionInstanceDetails *)0x0);
      local_210 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  &pAVar12->localVars;
      local_218 = context;
      uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          local_210,&local_208);
      uVar16 = uVar13 >> ((byte)(pAVar12->localVars).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar1 = (uVar13 & 0xff) * 4;
      uVar18 = (&UNK_0042856c)[lVar1];
      uVar19 = (&UNK_0042856d)[lVar1];
      uVar20 = (&UNK_0042856e)[lVar1];
      bVar21 = (&UNK_0042856f)[lVar1];
      uVar14 = (ulong)((uint)uVar13 & 7);
      nameParts_01 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)0x0;
      uVar22 = uVar18;
      uVar23 = uVar19;
      uVar24 = uVar20;
      bVar25 = bVar21;
      uVar26 = uVar18;
      uVar27 = uVar19;
      uVar28 = uVar20;
      bVar29 = bVar21;
      uVar30 = uVar18;
      uVar31 = uVar19;
      uVar32 = uVar20;
      bVar33 = bVar21;
      do {
        this = local_210;
        pgVar3 = (pAVar12->localVars).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                 .arrays.groups_;
        pgVar2 = pgVar3 + uVar16;
        local_1b8 = pgVar2->m[0].n;
        uStack_1b7 = pgVar2->m[1].n;
        uStack_1b6 = pgVar2->m[2].n;
        bStack_1b5 = pgVar2->m[3].n;
        uStack_1b4 = pgVar2->m[4].n;
        uStack_1b3 = pgVar2->m[5].n;
        uStack_1b2 = pgVar2->m[6].n;
        bStack_1b1 = pgVar2->m[7].n;
        uStack_1b0 = pgVar2->m[8].n;
        uStack_1af = pgVar2->m[9].n;
        uStack_1ae = pgVar2->m[10].n;
        bStack_1ad = pgVar2->m[0xb].n;
        uStack_1ac = pgVar2->m[0xc].n;
        uStack_1ab = pgVar2->m[0xd].n;
        uStack_1aa = pgVar2->m[0xe].n;
        bVar15 = pgVar2->m[0xf].n;
        auVar17[0] = -(local_1b8 == uVar18);
        auVar17[1] = -(uStack_1b7 == uVar19);
        auVar17[2] = -(uStack_1b6 == uVar20);
        auVar17[3] = -(bStack_1b5 == bVar21);
        auVar17[4] = -(uStack_1b4 == uVar22);
        auVar17[5] = -(uStack_1b3 == uVar23);
        auVar17[6] = -(uStack_1b2 == uVar24);
        auVar17[7] = -(bStack_1b1 == bVar25);
        auVar17[8] = -(uStack_1b0 == uVar26);
        auVar17[9] = -(uStack_1af == uVar27);
        auVar17[10] = -(uStack_1ae == uVar28);
        auVar17[0xb] = -(bStack_1ad == bVar29);
        auVar17[0xc] = -(uStack_1ac == uVar30);
        auVar17[0xd] = -(uStack_1ab == uVar31);
        auVar17[0xe] = -(uStack_1aa == uVar32);
        auVar17[0xf] = -(bVar15 == bVar33);
        uVar10 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
        bStack_1a9 = bVar15;
        if (uVar10 != 0) {
          local_230 = pgVar3 + uVar16;
          ppVar4 = (pAVar12->localVars).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                   .arrays.elements_;
          local_240 = result;
          local_238 = uVar14;
          local_228 = nameParts_01;
          local_220 = uVar16;
          local_1c8 = uVar18;
          uStack_1c7 = uVar19;
          uStack_1c6 = uVar20;
          bStack_1c5 = bVar21;
          uStack_1c4 = uVar22;
          uStack_1c3 = uVar23;
          uStack_1c2 = uVar24;
          bStack_1c1 = bVar25;
          uStack_1c0 = uVar26;
          uStack_1bf = uVar27;
          uStack_1be = uVar28;
          bStack_1bd = bVar29;
          uStack_1bc = uVar30;
          uStack_1bb = uVar31;
          uStack_1ba = uVar32;
          bStack_1b9 = bVar33;
          do {
            uVar5 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            __y = ppVar4 + uVar16 * 0xf + (ulong)uVar5;
            bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()(this,&local_208,&__y->first);
            if (bVar8) {
              local_240->found = __y->second;
              nameParts_00._M_extent._M_extent_value = local_168[0].len;
              nameParts_00._M_ptr = local_168[0].data_;
              name.text._M_str = local_208._M_str;
              name.text._M_len = local_208._M_len;
              name.range.startLoc = local_1f8;
              name.range.endLoc = SStack_1f0;
              name.selectors._M_ptr = local_1e8;
              name.selectors._M_extent._M_extent_value = sStack_1e0;
              name.paramAssignments = local_1d8;
              nameParts_01 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                             local_168[0].len;
              bVar8 = anon_unknown_39::lookupDownward
                                (nameParts_00,name,local_218,(bitmask<slang::ast::LookupFlags>)0x0,
                                 local_240);
              goto LAB_002e9d7a;
            }
            uVar10 = uVar10 - 1 & uVar10;
          } while (uVar10 != 0);
          bVar15 = local_230->m[0xf].n;
          uVar14 = local_238;
          uVar16 = local_220;
          nameParts_01 = local_228;
          result = local_240;
          uVar18 = local_1c8;
          uVar19 = uStack_1c7;
          uVar20 = uStack_1c6;
          bVar21 = bStack_1c5;
          uVar22 = uStack_1c4;
          uVar23 = uStack_1c3;
          uVar24 = uStack_1c2;
          bVar25 = bStack_1c1;
          uVar26 = uStack_1c0;
          uVar27 = uStack_1bf;
          uVar28 = uStack_1be;
          bVar29 = bStack_1bd;
          uVar30 = uStack_1bc;
          uVar31 = uStack_1bb;
          uVar32 = uStack_1ba;
          bVar33 = bStack_1b9;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar14] & bVar15) == 0) goto LAB_002e9d19;
        pSVar11 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                  (pAVar12->localVars).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .arrays.groups_size_mask;
        pcVar6 = nameParts_01->firstElement;
        nameParts_01 = (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                       ((long)&nameParts_01->data_ + 1);
        uVar16 = (ulong)(pcVar6 + (uVar16 - 0x17)) & (ulong)pSVar11;
        bVar8 = false;
      } while (nameParts_01 <= pSVar11);
      goto LAB_002e9d7a;
    }
  }
LAB_002e9d19:
  bVar8 = false;
LAB_002e9d7a:
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
            (local_168,(EVP_PKEY_CTX *)nameParts_01);
  return bVar8;
}

Assistant:

bool Lookup::findAssertionLocalVar(const ASTContext& context, const NameSyntax& syntax,
                                   LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    auto inst = context.assertionInstance;
    SLANG_ASSERT(inst);

    while (inst->argDetails)
        inst = inst->argDetails;

    auto& map = inst->localVars;
    auto it = map.find(name.text);
    if (it == map.end())
        return false;

    result.found = it->second;
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}